

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O1

ExpressionValue *
expFuncFind(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
           vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  int64_t iVar2;
  ExpressionValueType EVar3;
  StringLiteral *value;
  StringLiteral *source;
  int64_t start;
  StringLiteral *local_38;
  StringLiteral *local_30;
  ulong local_28;
  
  EVar3 = Invalid;
  bVar1 = getExpFuncParameter(parameters,0,&local_30,funcName,false);
  iVar2 = 0;
  if (bVar1) {
    bVar1 = getExpFuncParameter(parameters,1,&local_38,funcName,false);
    if (bVar1) {
      local_28 = 0;
      EVar3 = Integer;
      bVar1 = getExpFuncParameter(parameters,2,(int64_t *)&local_28,funcName,true);
      if (bVar1) {
        iVar2 = std::__cxx11::string::find
                          ((char *)local_30,(ulong)(local_38->_value)._M_dataplus._M_p,local_28);
        goto LAB_0012e4e3;
      }
    }
    EVar3 = Invalid;
    iVar2 = 0;
  }
LAB_0012e4e3:
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = EVar3;
  (__return_storage_ptr__->field_1).intValue = iVar2;
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncFind(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	int64_t start;
	const StringLiteral* source;
	const StringLiteral* value;

	GET_PARAM(parameters,0,source);
	GET_PARAM(parameters,1,value);
	GET_OPTIONAL_PARAM(parameters,2,start,0);

	size_t pos = source->string().find(value->string(),(size_t)start);
	return ExpressionValue(pos == std::string::npos ? INT64_C(-1) : (int64_t) pos);
}